

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_gen.cc
# Opt level: O1

vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
* __thiscall
google::protobuf::internal::TailCallTableInfo::BuildFieldEntries
          (vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
           *__return_storage_ptr__,TailCallTableInfo *this,Descriptor *descriptor,
          MessageOptions *message_options,
          Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> ordered_fields,
          vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
          *aux_entries)

{
  pointer *ppFVar1;
  pointer *ppAVar2;
  byte bVar3;
  uint8_t uVar4;
  uint32_t uVar5;
  iterator __position;
  pointer pFVar6;
  pointer pAVar7;
  anon_union_8_4_4b2d21c6_for_AuxEntry_1 aVar8;
  long lVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  *pvVar14;
  bool bVar15;
  Utf8CheckMode UVar16;
  TransformValidation TVar17;
  CppStringType CVar18;
  uint uVar19;
  ulong uVar20;
  OneofDescriptor *pOVar21;
  EnumDescriptor *pEVar22;
  Descriptor *pDVar23;
  FieldDescriptor *pFVar24;
  Nonnull<const_char_*> pcVar25;
  bool v1;
  int line;
  long lVar26;
  vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  *pvVar27;
  TransformValidation TVar28;
  unsigned_long uVar29;
  byte bVar30;
  iterator iVar31;
  pointer __n;
  FieldOptions *options;
  FieldOptions *options_00;
  int32_t last;
  int32_t first;
  undefined1 local_80 [16];
  undefined4 uStack_70;
  uint uStack_6c;
  vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  *local_68;
  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  *local_60;
  long local_58;
  Descriptor *local_50;
  long local_48;
  unsigned_long local_40;
  int32_t local_38;
  int32_t local_34;
  
  __n = ordered_fields.ptr_;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = __return_storage_ptr__;
  local_50 = descriptor;
  std::
  vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
  ::reserve(__return_storage_ptr__,(size_type)__n);
  local_60 = (vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
              *)ordered_fields.len_;
  if (__n == (pointer)0x0) {
    uVar29 = 0;
  }
  else {
    lVar26 = (long)__n << 5;
    uVar29 = 0;
    options_00 = (FieldOptions *)message_options;
    do {
      pFVar24 = options_00->field;
      if ((((pFVar24->type_ & 0xfe) != 10) ||
          (((pFVar24->type_ == 0xb &&
            (bVar15 = FieldDescriptor::is_map_message_type(pFVar24), bVar15)) ||
           ((pFVar24->options_->field_0)._impl_.weak_ != false)))) ||
         (((bVar15 = anon_unknown_36::HasLazyRep(pFVar24,options_00), bVar15 ||
           (options_00->is_implicitly_weak != false)) ||
          (options_00->use_direct_tcparser_table != true)))) {
        uVar20 = 0;
      }
      else {
        uVar20 = (ulong)(0.005 <= options_00->presence_probability);
      }
      uVar29 = uVar29 + uVar20;
      options_00 = options_00 + 1;
      lVar26 = lVar26 + -0x20;
    } while (lVar26 != 0);
  }
  lVar26 = (long)(local_60->
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(local_60->
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 4;
  local_40 = uVar29;
  std::
  vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
  ::resize(local_60,lVar26 + uVar29);
  pvVar27 = local_68;
  local_58 = lVar26;
  local_48 = lVar26;
  if (__n == (pointer)0x0) {
LAB_0043e318:
    if (local_58 - local_48 == local_40) {
      pcVar25 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                          (local_58 - local_48,local_40,
                           "subtable_aux_idx - subtable_aux_idx_begin == num_non_cold_subtables");
    }
    if (pcVar25 == (Nonnull<const_char_*>)0x0) {
      return pvVar27;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
               ,0x38e,pcVar25);
LAB_0043e393:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_80)
    ;
  }
  lVar26 = (long)__n << 5;
LAB_0043d577:
  pFVar24 = ((FieldOptions *)message_options)->field;
  local_80._8_4_ = ((FieldOptions *)message_options)->has_bit_index;
  uStack_6c = uStack_6c & 0xffffff00;
  local_80._12_4_ = 0;
  uStack_70._0_2_ = 0;
  uStack_70._2_2_ = 0;
  __position._M_current =
       (pvVar27->
       super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_80._0_8_ = pFVar24;
  if (__position._M_current ==
      (pvVar27->
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
    ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>
              (pvVar27,__position,(FieldEntryInfo *)local_80);
  }
  else {
    lVar9 = (ulong)uStack_6c << 0x20;
    (__position._M_current)->aux_idx = (short)lVar9;
    (__position._M_current)->type_card = (short)((ulong)lVar9 >> 0x10);
    (__position._M_current)->utf8_check_mode = (char)((ulong)lVar9 >> 0x20);
    *(int3 *)&(__position._M_current)->field_0x15 = (int3)((ulong)lVar9 >> 0x28);
    (__position._M_current)->field = pFVar24;
    (__position._M_current)->hasbit_idx = (int)(ulong)(uint)local_80._8_4_;
    (__position._M_current)->inlined_string_idx = (int)((ulong)(uint)local_80._8_4_ >> 0x20);
    ppFVar1 = &(pvVar27->
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppFVar1 = *ppFVar1 + 1;
  }
  pFVar6 = (pvVar27->
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  UVar16 = cpp::GetUtf8CheckMode(pFVar24,(bool)(local_50->super_SymbolBase).symbol_type_);
  pFVar6[-1].utf8_check_mode = UVar16;
  TVar28 = 0x10;
  if (pFVar6[-1].hasbit_idx < 0) {
    bVar3 = pFVar24->field_0x1;
    bVar15 = (bool)((bVar3 & 0x20) >> 5);
    if (0xbf < bVar3 == bVar15) {
      pcVar25 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar15,0xbf < bVar3,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar25 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar25);
      goto LAB_0043e393;
    }
    TVar28 = 0x20;
    if ((pFVar24->field_0x1 & 0x20) == 0) {
      if ((pFVar24->field_0x3 & 1) == 0) {
        TVar28 = 0;
      }
      else {
        if ((pFVar24->field_0x1 & 0x10) == 0) {
          pOVar21 = (OneofDescriptor *)0x0;
        }
        else {
          pOVar21 = (pFVar24->scope_).containing_oneof;
          if (pOVar21 == (OneofDescriptor *)0x0) {
            line = 0xb31;
            goto LAB_0043e59e;
          }
        }
        if (pOVar21 == (OneofDescriptor *)0x0) {
          line = 0xb63;
LAB_0043e59e:
          protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,line);
        }
        TVar28 = 0x30;
        if ((pOVar21->field_count_ == 1) && ((pOVar21->fields_->field_0x1 & 2) != 0)) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_80,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb64,"!res->is_synthetic()");
          goto LAB_0043e393;
        }
      }
    }
  }
  switch(pFVar24->type_) {
  case '\x01':
    bVar3 = pFVar24->field_0x1;
    bVar15 = (bool)((bVar3 & 0x20) >> 5);
    if (0xbf < bVar3 == bVar15) {
      pcVar25 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar15,0xbf < bVar3,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar25 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar25);
      goto LAB_0043e393;
    }
    TVar17 = 0x18c3;
    if ((pFVar24->field_0x1 & 0x20) != 0) {
      bVar15 = FieldDescriptor::is_packed(pFVar24);
      TVar17 = bVar15 + 0x18c3;
    }
    break;
  case '\x02':
    bVar3 = pFVar24->field_0x1;
    bVar15 = (bool)((bVar3 & 0x20) >> 5);
    if (0xbf < bVar3 == bVar15) {
      pcVar25 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar15,0xbf < bVar3,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar25 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar25);
      goto LAB_0043e393;
    }
    TVar17 = 0x1883;
    if ((pFVar24->field_0x1 & 0x20) != 0) {
      bVar15 = FieldDescriptor::is_packed(pFVar24);
      TVar17 = bVar15 + 0x1883;
    }
    break;
  case '\x03':
    bVar3 = pFVar24->field_0x1;
    bVar15 = (bool)((bVar3 & 0x20) >> 5);
    if (0xbf < bVar3 == bVar15) {
      pcVar25 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar15,0xbf < bVar3,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar25 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar25);
      goto LAB_0043e393;
    }
    TVar17 = 0x10c1;
    if ((pFVar24->field_0x1 & 0x20) != 0) {
      bVar15 = FieldDescriptor::is_packed(pFVar24);
      TVar17 = bVar15 + 0x10c1;
    }
    break;
  case '\x04':
    bVar3 = pFVar24->field_0x1;
    bVar15 = (bool)((bVar3 & 0x20) >> 5);
    if (0xbf < bVar3 == bVar15) {
      pcVar25 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar15,0xbf < bVar3,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar25 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar25);
      goto LAB_0043e393;
    }
    TVar17 = 0x8c1;
    if ((pFVar24->field_0x1 & 0x20) != 0) {
      bVar15 = FieldDescriptor::is_packed(pFVar24);
      TVar17 = bVar15 + 0x8c1;
    }
    break;
  case '\x05':
    bVar3 = pFVar24->field_0x1;
    bVar15 = (bool)((bVar3 & 0x20) >> 5);
    if (0xbf < bVar3 == bVar15) {
      pcVar25 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar15,0xbf < bVar3,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar25 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar25);
      goto LAB_0043e393;
    }
    TVar17 = 0x1081;
    if ((pFVar24->field_0x1 & 0x20) != 0) {
      bVar15 = FieldDescriptor::is_packed(pFVar24);
      TVar17 = bVar15 + 0x1081;
    }
    break;
  case '\x06':
    bVar3 = pFVar24->field_0x1;
    bVar15 = (bool)((bVar3 & 0x20) >> 5);
    if (0xbf < bVar3 == bVar15) {
      pcVar25 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar15,0xbf < bVar3,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar25 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar25);
      goto LAB_0043e393;
    }
    TVar17 = 0x8c3;
    if ((pFVar24->field_0x1 & 0x20) != 0) {
      bVar15 = FieldDescriptor::is_packed(pFVar24);
      TVar17 = bVar15 + 0x8c3;
    }
    break;
  case '\a':
    bVar3 = pFVar24->field_0x1;
    bVar15 = (bool)((bVar3 & 0x20) >> 5);
    if (0xbf < bVar3 == bVar15) {
      pcVar25 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar15,0xbf < bVar3,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar25 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar25);
      goto LAB_0043e393;
    }
    TVar17 = 0x883;
    if ((pFVar24->field_0x1 & 0x20) != 0) {
      bVar15 = FieldDescriptor::is_packed(pFVar24);
      TVar17 = bVar15 + 0x883;
    }
    break;
  case '\b':
    bVar3 = pFVar24->field_0x1;
    bVar15 = (bool)((bVar3 & 0x20) >> 5);
    if (0xbf < bVar3 == bVar15) {
      pcVar25 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar15,0xbf < bVar3,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar25 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar25);
      goto LAB_0043e393;
    }
    TVar17 = 1;
    if ((pFVar24->field_0x1 & 0x20) != 0) {
      bVar15 = FieldDescriptor::is_packed(pFVar24);
      TVar17 = bVar15 + 1;
    }
    break;
  case '\t':
    if (UVar16 == kNone) goto switchD_0043d67b_caseD_c;
    if (UVar16 == kVerify) {
      TVar28 = TVar28 | 0xa05;
    }
    else if (UVar16 == kStrict) {
      TVar28 = TVar28 | 0xc05;
    }
    goto switchD_0043d67b_default;
  case '\n':
    if (((FieldOptions *)message_options)->is_implicitly_weak == true) {
      TVar28 = TVar28 | 0x646;
    }
    else if (((FieldOptions *)message_options)->use_direct_tcparser_table == true) {
      TVar28 = TVar28 | 0x446;
    }
    else {
      TVar28 = TVar28 | 0x246;
    }
    goto switchD_0043d67b_default;
  case '\v':
    bVar15 = FieldDescriptor::is_map_message_type(pFVar24);
    if (bVar15) {
      TVar28 = TVar28 | 7;
    }
    else {
      bVar15 = anon_unknown_36::HasLazyRep(pFVar24,(FieldOptions *)message_options);
      if (bVar15) {
        TVar17 = ((FieldOptions *)message_options)->lazy_opt;
        if ((TVar17 == kTvDefault) || (TVar17 == kTvEnum)) {
          TVar28 = TVar28 | TVar17 | 0x86;
          goto switchD_0043d67b_default;
        }
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                   ,0x292,
                   "options.lazy_opt == field_layout::kTvEager || options.lazy_opt == field_layout::kTvLazy"
                  );
        goto LAB_0043e393;
      }
      if (((FieldOptions *)message_options)->is_implicitly_weak == true) {
        TVar28 = TVar28 | 0x606;
      }
      else if (((FieldOptions *)message_options)->use_direct_tcparser_table == true) {
        TVar28 = TVar28 | 0x406;
      }
      else {
        TVar28 = TVar28 | 0x206;
      }
    }
    goto switchD_0043d67b_default;
  case '\f':
switchD_0043d67b_caseD_c:
    TVar28 = TVar28 | 0x805;
    goto switchD_0043d67b_default;
  case '\r':
    bVar3 = pFVar24->field_0x1;
    bVar15 = (bool)((bVar3 & 0x20) >> 5);
    if (0xbf < bVar3 == bVar15) {
      pcVar25 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar15,0xbf < bVar3,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar25 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar25);
      goto LAB_0043e393;
    }
    TVar17 = 0x881;
    if ((pFVar24->field_0x1 & 0x20) != 0) {
      bVar15 = FieldDescriptor::is_packed(pFVar24);
      TVar17 = bVar15 + 0x881;
    }
    break;
  case '\x0e':
    bVar15 = anon_unknown_36::TreatEnumAsInt(pFVar24);
    if (bVar15) {
      bVar3 = pFVar24->field_0x1;
      bVar15 = (bool)((bVar3 & 0x20) >> 5);
      if (0xbf < bVar3 == bVar15) {
        pcVar25 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar15,0xbf < bVar3,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar25 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,pcVar25);
        goto LAB_0043e393;
      }
      TVar17 = 0x1881;
      if ((pFVar24->field_0x1 & 0x20) != 0) {
        bVar15 = FieldDescriptor::is_packed(pFVar24);
        TVar17 = bVar15 + 0x1881;
      }
    }
    else {
      pEVar22 = FieldDescriptor::enum_type(pFVar24);
      bVar15 = anon_unknown_36::GetEnumValidationRange(pEVar22,&local_34,&local_38);
      bVar3 = pFVar24->field_0x1;
      v1 = (bool)((bVar3 & 0x20) >> 5);
      bVar30 = 0xbf < bVar3 ^ v1;
      if (bVar15) {
        if (bVar30 == 0) {
          pcVar25 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (v1,0xbf < bVar3,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar25 != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_80,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar25);
          goto LAB_0043e393;
        }
        TVar17 = 0x1e81;
        if ((pFVar24->field_0x1 & 0x20) != 0) {
          bVar15 = FieldDescriptor::is_packed(pFVar24);
          TVar17 = bVar15 + 0x1e81;
        }
      }
      else {
        if (bVar30 == 0) {
          pcVar25 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                              (v1,0xbf < bVar3,
                               "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
        }
        if (pcVar25 != (Nonnull<const_char_*>)0x0) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)local_80,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,pcVar25);
          goto LAB_0043e393;
        }
        TVar17 = 0x1c81;
        if ((pFVar24->field_0x1 & 0x20) != 0) {
          bVar15 = FieldDescriptor::is_packed(pFVar24);
          TVar17 = bVar15 + 0x1c81;
        }
      }
    }
    break;
  case '\x0f':
    bVar3 = pFVar24->field_0x1;
    bVar15 = (bool)((bVar3 & 0x20) >> 5);
    if (0xbf < bVar3 == bVar15) {
      pcVar25 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar15,0xbf < bVar3,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar25 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar25);
      goto LAB_0043e393;
    }
    TVar17 = 0x1083;
    if ((pFVar24->field_0x1 & 0x20) != 0) {
      bVar15 = FieldDescriptor::is_packed(pFVar24);
      TVar17 = bVar15 + 0x1083;
    }
    break;
  case '\x10':
    bVar3 = pFVar24->field_0x1;
    bVar15 = (bool)((bVar3 & 0x20) >> 5);
    if (0xbf < bVar3 == bVar15) {
      pcVar25 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar15,0xbf < bVar3,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar25 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar25);
      goto LAB_0043e393;
    }
    TVar17 = 0x10c3;
    if ((pFVar24->field_0x1 & 0x20) != 0) {
      bVar15 = FieldDescriptor::is_packed(pFVar24);
      TVar17 = bVar15 + 0x10c3;
    }
    break;
  case '\x11':
    bVar3 = pFVar24->field_0x1;
    bVar15 = (bool)((bVar3 & 0x20) >> 5);
    if (0xbf < bVar3 == bVar15) {
      pcVar25 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar15,0xbf < bVar3,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar25 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar25);
      goto LAB_0043e393;
    }
    TVar17 = 0x1281;
    if ((pFVar24->field_0x1 & 0x20) != 0) {
      bVar15 = FieldDescriptor::is_packed(pFVar24);
      TVar17 = bVar15 + 0x1281;
    }
    break;
  case '\x12':
    bVar3 = pFVar24->field_0x1;
    bVar15 = (bool)((bVar3 & 0x20) >> 5);
    if (0xbf < bVar3 == bVar15) {
      pcVar25 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar15,0xbf < bVar3,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar25 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar25);
      goto LAB_0043e393;
    }
    TVar17 = 0x12c1;
    if ((pFVar24->field_0x1 & 0x20) != 0) {
      bVar15 = FieldDescriptor::is_packed(pFVar24);
      TVar17 = bVar15 + 0x12c1;
    }
    break;
  default:
    goto switchD_0043d67b_default;
  }
  TVar28 = TVar17 | TVar28;
switchD_0043d67b_default:
  if ((pFVar24->type_ == '\f') || (pFVar24->type_ == '\t')) {
    CVar18 = FieldDescriptor::cpp_string_type(pFVar24);
    if ((CVar18 == kView) || (CVar18 == kString)) {
      bVar3 = pFVar24->field_0x1;
      bVar15 = (bool)((bVar3 & 0x20) >> 5);
      if (0xbf < bVar3 == bVar15) {
        pcVar25 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar15,0xbf < bVar3,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar25 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,pcVar25);
        goto LAB_0043e393;
      }
      if ((pFVar24->field_0x1 & 0x20) == 0) {
        TVar17 = 0;
        if (((FieldOptions *)message_options)->use_micro_string != false) {
          TVar17 = 0x140;
        }
        TVar28 = TVar28 | TVar17;
      }
      else {
        TVar28 = TVar28 | 0x100;
      }
    }
    else if (CVar18 == kCord) {
      TVar28 = TVar28 | 0x80;
    }
  }
  uVar12 = local_80._12_4_;
  uVar10 = local_80._8_4_;
  TVar17 = TVar28 | 8;
  if (((FieldOptions *)message_options)->should_split == false) {
    TVar17 = TVar28;
  }
  pFVar6[-1].type_card = TVar17;
  uVar4 = pFVar24->type_;
  local_80._8_4_ = SUB84(pFVar24,0);
  uVar11 = local_80._8_4_;
  local_80._12_4_ = (undefined4)((ulong)pFVar24 >> 0x20);
  uVar13 = local_80._12_4_;
  local_80._8_4_ = uVar10;
  local_80._12_4_ = uVar12;
  if (uVar4 == '\n') {
LAB_0043dbb0:
    if ((pFVar24->options_->field_0)._impl_.weak_ == true) {
      pFVar6[-1].type_card = 0;
      pvVar27 = local_68;
    }
    else {
      bVar15 = anon_unknown_36::HasLazyRep(pFVar24,(FieldOptions *)message_options);
      pvVar27 = local_68;
      if (bVar15) {
        if (local_50->field_0x1 == '\x01') {
          iVar31._M_current =
               (local_60->
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          pFVar6[-1].aux_idx =
               (uint16_t)
               ((uint)((int)iVar31._M_current -
                      *(int *)&(local_60->
                               super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 4);
          local_80._0_4_ = 4;
          if (iVar31._M_current ==
              (local_60->
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_80._8_4_ = uVar11;
            local_80._12_4_ = uVar13;
            std::
            vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
            ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                      (local_60,iVar31,(AuxEntry *)local_80);
          }
          else {
            *(undefined8 *)iVar31._M_current = local_80._0_8_;
            ((iVar31._M_current)->field_1).field = pFVar24;
            ppAVar2 = &(local_60->
                       super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar2 = *ppAVar2 + 1;
          }
          if (((FieldOptions *)message_options)->lazy_opt == kTvDefault) {
            local_80._0_4_ = 7;
            iVar31._M_current =
                 (local_60->
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            local_80._8_4_ = uVar11;
            local_80._12_4_ = uVar13;
            if (iVar31._M_current ==
                (local_60->
                super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
              ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                        (local_60,iVar31,(AuxEntry *)local_80);
            }
            else {
LAB_0043e042:
              aVar8.enum_range.last = local_80._12_4_;
              aVar8.offset = local_80._8_4_;
              *(undefined8 *)iVar31._M_current = local_80._0_8_;
              (iVar31._M_current)->field_1 = aVar8;
              ppAVar2 = &(local_60->
                         super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppAVar2 = *ppAVar2 + 1;
            }
          }
          else {
            local_80._0_8_ = (ulong)(uint)local_80._4_4_ << 0x20;
            local_80._8_4_ = 0;
            local_80._12_4_ = 0;
            iVar31._M_current =
                 (local_60->
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            if (iVar31._M_current !=
                (local_60->
                super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0043e042;
            std::
            vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
            ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                      (local_60,iVar31,(AuxEntry *)local_80);
          }
        }
        else {
          pFVar6[-1].aux_idx = 0xffff;
        }
      }
      else {
        uVar19 = 6;
        if (((FieldOptions *)message_options)->is_implicitly_weak == false) {
          uVar19 = ((FieldOptions *)message_options)->use_direct_tcparser_table | 4;
        }
        if ((uVar19 != 5) || (((FieldOptions *)message_options)->presence_probability < 0.005)) {
          iVar31._M_current =
               (local_60->
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          pFVar6[-1].aux_idx =
               (uint16_t)
               ((uint)((int)iVar31._M_current -
                      *(int *)&(local_60->
                               super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                               )._M_impl.super__Vector_impl_data._M_start) >> 4);
          local_80._0_4_ = uVar19;
          if (iVar31._M_current ==
              (local_60->
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) {
            local_80._8_4_ = uVar11;
            local_80._12_4_ = uVar13;
            std::
            vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
            ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                      (local_60,iVar31,(AuxEntry *)local_80);
          }
          else {
            *(undefined8 *)iVar31._M_current = local_80._0_8_;
            ((iVar31._M_current)->field_1).field = pFVar24;
            ppAVar2 = &(local_60->
                       super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar2 = *ppAVar2 + 1;
            local_80._8_4_ = uVar11;
            local_80._12_4_ = uVar13;
          }
        }
        else {
          pAVar7 = (local_60->
                   super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pAVar7[local_58].type = kSubTable;
          pAVar7[local_58].field_1.field = pFVar24;
          pFVar6[-1].aux_idx = (uint16_t)local_58;
          local_58 = local_58 + 1;
        }
      }
    }
  }
  else {
    if (uVar4 == '\x0e') {
      bVar15 = anon_unknown_36::TreatEnumAsInt(pFVar24);
      pvVar14 = local_60;
      if (!bVar15) {
        iVar31._M_current =
             (local_60->
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        pFVar6[-1].aux_idx =
             (uint16_t)
             ((uint)((int)iVar31._M_current -
                    *(int *)&(local_60->
                             super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 4);
        local_80._0_8_ = local_80._0_8_ & 0xffffffff00000000;
        local_80._8_4_ = 0;
        local_80._12_4_ = 0;
        if (iVar31._M_current ==
            (local_60->
            super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
          ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                    (local_60,iVar31,(AuxEntry *)local_80);
        }
        else {
          *(undefined8 *)iVar31._M_current = local_80._0_8_;
          ((iVar31._M_current)->field_1).field = (FieldDescriptor *)0x0;
          ppAVar2 = &(local_60->
                     super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppAVar2 = *ppAVar2 + 1;
        }
        pAVar7 = (pvVar14->
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pEVar22 = FieldDescriptor::enum_type(pFVar24);
        bVar15 = anon_unknown_36::GetEnumValidationRange
                           (pEVar22,(int32_t *)&pAVar7[-1].field_1.offset,
                            &pAVar7[-1].field_1.enum_range.last);
        pvVar27 = local_68;
        if (bVar15) {
          pAVar7[-1].type = kEnumRange;
        }
        else {
          pAVar7[-1].type = kEnumValidator;
          pAVar7[-1].field_1.field = pFVar24;
        }
        goto LAB_0043de7e;
      }
    }
    else if (uVar4 == '\v') {
      bVar15 = FieldDescriptor::is_map_message_type(pFVar24);
      pvVar27 = local_68;
      if (!bVar15) goto LAB_0043dbb0;
      iVar31._M_current =
           (local_60->
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      pFVar6[-1].aux_idx =
           (uint16_t)
           ((uint)((int)iVar31._M_current -
                  *(int *)&(local_60->
                           super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 4);
      local_80._0_4_ = 0xc;
      if (iVar31._M_current ==
          (local_60->
          super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_80._8_4_ = uVar11;
        local_80._12_4_ = uVar13;
        std::
        vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
        ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                  (local_60,iVar31,(AuxEntry *)local_80);
      }
      else {
        *(undefined8 *)iVar31._M_current = local_80._0_8_;
        ((iVar31._M_current)->field_1).field = pFVar24;
        ppAVar2 = &(local_60->
                   super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar2 = *ppAVar2 + 1;
        local_80._8_4_ = uVar11;
        local_80._12_4_ = uVar13;
      }
      if (local_50->field_0x1 == '\x01') {
        pDVar23 = FieldDescriptor::message_type(pFVar24);
        pFVar24 = Descriptor::map_value(pDVar23);
        pDVar23 = FieldDescriptor::message_type(pFVar24);
        uVar11 = local_80._12_4_;
        uVar10 = local_80._8_4_;
        local_80._8_4_ = SUB84(pFVar24,0);
        uVar12 = local_80._8_4_;
        local_80._12_4_ = (undefined4)((ulong)pFVar24 >> 0x20);
        uVar13 = local_80._12_4_;
        if (pDVar23 == (Descriptor *)0x0) {
          local_80._8_4_ = uVar10;
          local_80._12_4_ = uVar11;
          if ((pFVar24->type_ == '\x0e') &&
             (bVar15 = cpp::HasPreservingUnknownEnumSemantics(pFVar24), !bVar15)) {
            local_80._0_4_ = 10;
            iVar31._M_current =
                 (local_60->
                 super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
            local_80._8_4_ = uVar12;
            local_80._12_4_ = uVar13;
            if (iVar31._M_current !=
                (local_60->
                super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0043e042;
            std::
            vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
            ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                      (local_60,iVar31,(AuxEntry *)local_80);
          }
        }
        else {
          local_80._0_4_ = 5;
          iVar31._M_current =
               (local_60->
               super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
               )._M_impl.super__Vector_impl_data._M_finish;
          local_80._8_4_ = uVar12;
          local_80._12_4_ = uVar13;
          if (iVar31._M_current !=
              (local_60->
              super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
              )._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_0043e042;
          std::
          vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
          ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                    (local_60,iVar31,(AuxEntry *)local_80);
        }
      }
      goto LAB_0043de7e;
    }
    pvVar27 = local_68;
    if (((pFVar24->type_ == '\f') || (pFVar24->type_ == '\t')) &&
       (((FieldOptions *)message_options)->is_string_inlined == true)) {
      bVar3 = pFVar24->field_0x1;
      bVar15 = (bool)((bVar3 & 0x20) >> 5);
      if (0xbf < bVar3 == bVar15) {
        pcVar25 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar25 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar15,0xbf < bVar3,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      pvVar14 = local_60;
      if (pcVar25 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,pcVar25);
        goto LAB_0043e393;
      }
      if ((pFVar24->field_0x1 & 0x20) != 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_80,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_gen.cc"
                   ,0x380,"!field->is_repeated()");
        goto LAB_0043e393;
      }
      uVar5 = ((FieldOptions *)message_options)->inlined_string_index;
      iVar31._M_current =
           (local_60->
           super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      pFVar6[-1].aux_idx =
           (uint16_t)
           ((uint)((int)iVar31._M_current -
                  *(int *)&(local_60->
                           super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 4);
      local_80._0_4_ = 0xb;
      local_80._8_4_ = 0;
      local_80._12_4_ = 0;
      if (iVar31._M_current ==
          (local_60->
          super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
        ::_M_realloc_insert<google::protobuf::internal::TailCallTableInfo::AuxEntry>
                  (local_60,iVar31,(AuxEntry *)local_80);
      }
      else {
        *(undefined8 *)iVar31._M_current = local_80._0_8_;
        ((iVar31._M_current)->field_1).field = (FieldDescriptor *)0x0;
        ppAVar2 = &(local_60->
                   super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppAVar2 = *ppAVar2 + 1;
      }
      (pvVar14->
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
      )._M_impl.super__Vector_impl_data._M_finish[-1].field_1.offset = uVar5;
      pFVar6[-1].inlined_string_idx = uVar5;
      pvVar27 = local_68;
    }
  }
LAB_0043de7e:
  message_options = (MessageOptions *)((long)message_options + 0x20);
  lVar26 = lVar26 + -0x20;
  if (lVar26 == 0) goto LAB_0043e318;
  goto LAB_0043d577;
}

Assistant:

std::vector<TailCallTableInfo::FieldEntryInfo>
TailCallTableInfo::BuildFieldEntries(
    const Descriptor* descriptor, const MessageOptions& message_options,
    absl::Span<const FieldOptions> ordered_fields,
    std::vector<TailCallTableInfo::AuxEntry>& aux_entries) {
  std::vector<FieldEntryInfo> field_entries;
  field_entries.reserve(ordered_fields.size());

  const auto is_non_cold = [](const FieldOptions& options) {
    return options.presence_probability >= 0.005;
  };
  size_t num_non_cold_subtables = 0;
  // We found that clustering non-cold subtables to the top of aux_entries
  // achieves the best load tests results than other strategies (e.g.,
  // clustering all non-cold entries).
  const auto is_non_cold_subtable = [&](const FieldOptions& options) {
    auto* field = options.field;
    // In the following code where we assign kSubTable to aux entries, only
    // the following typed fields are supported.
    return (field->type() == FieldDescriptor::TYPE_MESSAGE ||
            field->type() == FieldDescriptor::TYPE_GROUP) &&
           !field->is_map() && !field->options().weak() &&
           !HasLazyRep(field, options) && !options.is_implicitly_weak &&
           options.use_direct_tcparser_table && is_non_cold(options);
  };
  for (const FieldOptions& options : ordered_fields) {
    if (is_non_cold_subtable(options)) {
      num_non_cold_subtables++;
    }
  }

  size_t subtable_aux_idx_begin = aux_entries.size();
  size_t subtable_aux_idx = aux_entries.size();
  aux_entries.resize(aux_entries.size() + num_non_cold_subtables);

  // Fill in mini table entries.
  for (const auto& options : ordered_fields) {
    auto* field = options.field;
    field_entries.push_back({field, options.has_bit_index});
    auto& entry = field_entries.back();
    entry.utf8_check_mode =
        cpp::GetUtf8CheckMode(field, message_options.is_lite);
    entry.type_card = MakeTypeCardForField(field, entry.hasbit_idx >= 0,
                                           options, entry.utf8_check_mode);

    if (field->type() == FieldDescriptor::TYPE_MESSAGE ||
        field->type() == FieldDescriptor::TYPE_GROUP) {
      // Message-typed fields have a FieldAux with the default instance pointer.
      if (field->is_map()) {
        entry.aux_idx = aux_entries.size();
        aux_entries.push_back({kMapAuxInfo, {field}});
        if (message_options.uses_codegen) {
          // If we don't use codegen we can't add these.
          auto* map_value = field->message_type()->map_value();
          if (map_value->message_type() != nullptr) {
            aux_entries.push_back({kSubTable, {map_value}});
          } else if (map_value->type() == FieldDescriptor::TYPE_ENUM &&
                     !cpp::HasPreservingUnknownEnumSemantics(map_value)) {
            aux_entries.push_back({kEnumValidator, {map_value}});
          }
        }
      } else if (field->options().weak()) {
        // Disable the type card for this entry to force the fallback.
        entry.type_card = 0;
      } else if (HasLazyRep(field, options)) {
        if (message_options.uses_codegen) {
          entry.aux_idx = aux_entries.size();
          aux_entries.push_back({kSubMessage, {field}});
          if (options.lazy_opt == field_layout::kTvEager) {
            aux_entries.push_back({kMessageVerifyFunc, {field}});
          } else {
            aux_entries.push_back({kNothing});
          }
        } else {
          entry.aux_idx = TcParseTableBase::FieldEntry::kNoAuxIdx;
        }
      } else {
        AuxType type = options.is_implicitly_weak          ? kSubMessageWeak
                       : options.use_direct_tcparser_table ? kSubTable
                                                           : kSubMessage;
        if (type == kSubTable && is_non_cold(options)) {
          aux_entries[subtable_aux_idx] = {type, {field}};
          entry.aux_idx = subtable_aux_idx;
          ++subtable_aux_idx;
        } else {
          entry.aux_idx = aux_entries.size();
          aux_entries.push_back({type, {field}});
        }
      }
    } else if (field->type() == FieldDescriptor::TYPE_ENUM &&
               !TreatEnumAsInt(field)) {
      // Enum fields which preserve unknown values (proto3 behavior) are
      // effectively int32 fields with respect to parsing -- i.e., the value
      // does not need to be validated at parse time.
      //
      // Enum fields which do not preserve unknown values (proto2 behavior) use
      // a FieldAux to store validation information. If the enum values are
      // sequential (and within a range we can represent), then the FieldAux
      // entry represents the range using the minimum value (which must fit in
      // an int16_t) and count (a uint16_t). Otherwise, the entry holds a
      // pointer to the generated Name_IsValid function.

      entry.aux_idx = aux_entries.size();
      aux_entries.push_back({});
      auto& aux_entry = aux_entries.back();

      if (GetEnumValidationRange(field->enum_type(), aux_entry.enum_range.first,
                                 aux_entry.enum_range.last)) {
        aux_entry.type = kEnumRange;
      } else {
        aux_entry.type = kEnumValidator;
        aux_entry.field = field;
      }

    } else if ((field->type() == FieldDescriptor::TYPE_STRING ||
                field->type() == FieldDescriptor::TYPE_BYTES) &&
               options.is_string_inlined) {
      ABSL_CHECK(!field->is_repeated());
      // Inlined strings have an extra marker to represent their donation state.
      int idx = options.inlined_string_index;
      // For mini parsing, the donation state index is stored as an `offset`
      // auxiliary entry.
      entry.aux_idx = aux_entries.size();
      aux_entries.push_back({kNumericOffset});
      aux_entries.back().offset = idx;
      // For fast table parsing, the donation state index is stored instead of
      // the aux_idx (this will limit the range to 8 bits).
      entry.inlined_string_idx = idx;
    }
  }
  ABSL_CHECK_EQ(subtable_aux_idx - subtable_aux_idx_begin,
                num_non_cold_subtables);

  return field_entries;
}